

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::ReadRawBlockFromDisk
          (BlockManager *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *block,
          FlatFilePos *pos)

{
  long lVar1;
  pointer puVar2;
  size_t sVar3;
  bool bVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  uint blk_size;
  FlatFilePos hpos;
  MessageStartChars blk_start;
  uint32_t obj;
  undefined4 uStack_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  string local_80;
  AutoFile filein;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hpos = *pos;
  if (hpos.nPos < 8) {
    FlatFilePos::ToString_abi_cxx11_((string *)&filein,pos);
    logging_function._M_str = "ReadRawBlockFromDisk";
    logging_function._M_len = 0x14;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    LogPrintFormatInternal<char[21],std::__cxx11::string>
              (logging_function,source_file,0x43b,ALL,Error,(ConstevalFormatString<2U>)0x7ebc57,
               (char (*) [21])"ReadRawBlockFromDisk",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filein);
    if (filein.m_file !=
        (FILE *)&filein.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      operator_delete(filein.m_file,
                      (ulong)(filein.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1));
    }
    bVar4 = false;
    goto LAB_0020e4b9;
  }
  hpos.nPos = hpos.nPos - 8;
  sVar3 = 1;
  OpenBlockFile(&filein,this,&hpos,true);
  if (filein.m_file == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_(&local_80,pos);
    logging_function_01._M_str = "ReadRawBlockFromDisk";
    logging_function_01._M_len = 0x14;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x65;
    LogPrintFormatInternal<char[21],std::__cxx11::string>
              (logging_function_01,source_file_01,0x441,ALL,Error,
               (ConstevalFormatString<2U>)0x7ebc57,(char (*) [21])"ReadRawBlockFromDisk",&local_80);
LAB_0020e492:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  else {
    AutoFile::read(&filein,(int)&blk_start,(void *)0x4,sVar3);
    AutoFile::read(&filein,(int)&obj,(void *)0x4,sVar3);
    blk_size = obj;
    sVar3 = (size_t)(uint)blk_start._M_elems;
    if (blk_start._M_elems != *&(((this->m_opts).chainparams)->pchMessageStart)._M_elems) {
      FlatFilePos::ToString_abi_cxx11_(&local_80,pos);
      s.m_size = 4;
      s.m_data = blk_start._M_elems;
      HexStr_abi_cxx11_(&local_a0,s);
      s_00.m_data = &((this->m_opts).chainparams)->pchMessageStart;
      s_00.m_size = 4;
      HexStr_abi_cxx11_((string *)&obj,s_00);
      logging_function_00._M_str = "ReadRawBlockFromDisk";
      logging_function_00._M_len = 0x14;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_00._M_len = 0x65;
      LogPrintFormatInternal<char[21],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (logging_function_00,source_file_00,0x44e,ALL,Error,
                 (ConstevalFormatString<4U>)0x7ebd03,(char (*) [21])"ReadRawBlockFromDisk",&local_80
                 ,&local_a0,(string *)&obj);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_bc,obj) != &local_b0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_bc,obj),local_b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0020e492;
    }
    if (0x2000000 < obj) {
      FlatFilePos::ToString_abi_cxx11_(&local_80,pos);
      logging_function_02._M_str = "ReadRawBlockFromDisk";
      logging_function_02._M_len = 0x14;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_02._M_len = 0x65;
      LogPrintFormatInternal<char[21],std::__cxx11::string,unsigned_int,unsigned_long>
                (logging_function_02,source_file_02,0x454,ALL,Error,
                 (ConstevalFormatString<4U>)0x7ebd3b,(char (*) [21])"ReadRawBlockFromDisk",&local_80
                 ,&blk_size,&MAX_SIZE);
      goto LAB_0020e492;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(block,(ulong)obj);
    puVar2 = (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar4 = true;
    AutoFile::read(&filein,(int)puVar2,
                   (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -(long)puVar2,sVar3);
  }
  AutoFile::~AutoFile(&filein);
LAB_0020e4b9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadRawBlockFromDisk(std::vector<uint8_t>& block, const FlatFilePos& pos) const
{
    FlatFilePos hpos = pos;
    // If nPos is less than 8 the pos is null and we don't have the block data
    // Return early to prevent undefined behavior of unsigned int underflow
    if (hpos.nPos < 8) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }
    hpos.nPos -= 8; // Seek back 8 bytes for meta header
    AutoFile filein{OpenBlockFile(hpos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    try {
        MessageStartChars blk_start;
        unsigned int blk_size;

        filein >> blk_start >> blk_size;

        if (blk_start != GetParams().MessageStart()) {
            LogError("%s: Block magic mismatch for %s: %s versus expected %s\n", __func__, pos.ToString(),
                         HexStr(blk_start),
                         HexStr(GetParams().MessageStart()));
            return false;
        }

        if (blk_size > MAX_SIZE) {
            LogError("%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n", __func__, pos.ToString(),
                         blk_size, MAX_SIZE);
            return false;
        }

        block.resize(blk_size); // Zeroing of memory is intentional here
        filein.read(MakeWritableByteSpan(block));
    } catch (const std::exception& e) {
        LogError("%s: Read from block file failed: %s for %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    return true;
}